

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.h
# Opt level: O0

bool clickhouse::WireFormat::ReadString(CodedInputStream *input,string *value)

{
  bool bVar1;
  ulong in_RSI;
  uint64_t *in_RDI;
  CodedInputStream *unaff_retaddr;
  uint64_t len;
  undefined8 local_20;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  bVar1 = CodedInputStream::ReadVarint64
                    ((CodedInputStream *)
                     CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),in_RDI);
  if (bVar1) {
    if (local_20 < 0x1000000) {
      std::__cxx11::string::resize(in_RSI);
      std::__cxx11::string::operator[](in_RSI);
      bVar1 = CodedInputStream::ReadRaw
                        (unaff_retaddr,
                         (void *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                         (size_t)in_RDI);
    }
    else {
      bVar1 = false;
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

inline bool WireFormat::ReadString(
    CodedInputStream* input,
    std::string* value)
{
    uint64_t len;

    if (input->ReadVarint64(&len)) {
        if (len > 0x00FFFFFFULL) {
            return false;
        }
        value->resize((size_t)len);
        return input->ReadRaw(&(*value)[0], (size_t)len);
    }

    return false;
}